

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
cppcms::json::value::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,value *this,string *path)

{
  value *v;
  
  v = at(this,path);
  traits<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::get
            (__return_storage_ptr__,v);
  return __return_storage_ptr__;
}

Assistant:

T get(std::string const &path) const
		{
			return at(path).get_value<T>();
		}